

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int c1fgkf_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  double dVar40;
  double *local_100;
  double *local_d8;
  ulong local_a0;
  
  uVar4 = *ido;
  lVar29 = (long)(int)uVar4;
  iVar10 = *ip;
  lVar36 = (long)iVar10;
  uVar8 = ~(iVar10 * uVar4);
  iVar14 = *in1;
  lVar33 = (long)iVar14;
  iVar5 = *lid;
  lVar30 = (long)iVar5;
  uVar13 = iVar5 + 1;
  iVar6 = *in2;
  lVar35 = (long)iVar6;
  uVar37 = (ulong)uVar13;
  iVar7 = *l1;
  lVar21 = (long)iVar7;
  uVar18 = iVar10 + 1;
  lVar15 = (long)(int)~(uVar13 * iVar14);
  lVar38 = (long)(int)~(iVar6 * uVar13);
  if (0 < lVar30) {
    pdVar12 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
    pdVar24 = cc1 + (lVar30 + 1) * lVar33 + lVar15 + 2;
    lVar32 = uVar37 - 1;
    do {
      pdVar12[-1] = pdVar24[-1];
      *pdVar12 = *pdVar24;
      pdVar12 = pdVar12 + lVar35;
      pdVar24 = pdVar24 + lVar33;
      lVar32 = lVar32 + -1;
    } while (lVar32 != 0);
  }
  uVar26 = (ulong)uVar4;
  uVar13 = iVar10 + 2;
  iVar25 = (iVar10 - ((int)uVar18 >> 0x1f)) + 1 >> 1;
  if (2 < iVar10) {
    iVar19 = 2;
    if (2 < iVar25) {
      iVar19 = iVar25;
    }
    lVar32 = ((ulong)uVar13 - 2) * lVar30 + 1;
    pdVar12 = ch1 + lVar32 * lVar35 + 2;
    pdVar17 = cc1 + lVar32 * lVar33 + lVar15;
    lVar32 = lVar30 * 2 + 1;
    pdVar24 = ch1 + lVar32 * lVar35 + 2;
    pdVar34 = cc1 + lVar32 * lVar33 + lVar15;
    uVar27 = 2;
    do {
      if (0 < iVar5) {
        lVar39 = 0x10;
        lVar32 = uVar37 - 1;
        pdVar11 = pdVar12;
        pdVar23 = pdVar24;
        do {
          pdVar23[lVar38 + -1] =
               *(double *)((long)pdVar34 + lVar39 + -8) + *(double *)((long)pdVar17 + lVar39 + -8);
          pdVar11[lVar38 + -1] =
               *(double *)((long)pdVar34 + lVar39 + -8) - *(double *)((long)pdVar17 + lVar39 + -8);
          pdVar23[lVar38] =
               *(double *)((long)pdVar34 + lVar39) + *(double *)((long)pdVar17 + lVar39);
          pdVar11[lVar38] =
               *(double *)((long)pdVar34 + lVar39) - *(double *)((long)pdVar17 + lVar39);
          pdVar11 = pdVar11 + lVar35;
          lVar39 = lVar39 + lVar33 * 8;
          pdVar23 = pdVar23 + lVar35;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      uVar27 = uVar27 + 1;
      pdVar12 = pdVar12 + -(lVar30 * lVar35);
      pdVar17 = pdVar17 + -(lVar30 * lVar33);
      pdVar24 = pdVar24 + lVar30 * lVar35;
      pdVar34 = pdVar34 + lVar30 * lVar33;
    } while (uVar27 != iVar19 + 1);
  }
  if (2 < iVar10) {
    iVar19 = 2;
    if (2 < iVar25) {
      iVar19 = iVar25;
    }
    pdVar12 = ch1 + (lVar30 * 2 + 1) * lVar35 + lVar38 + 2;
    uVar27 = 2;
    do {
      pdVar24 = pdVar12;
      lVar32 = uVar37 - 1;
      pdVar17 = cc1 + (lVar30 + 1) * lVar33 + lVar15 + 2;
      if (0 < iVar5) {
        do {
          pdVar17[-1] = pdVar24[-1] + pdVar17[-1];
          *pdVar17 = *pdVar24 + *pdVar17;
          pdVar17 = pdVar17 + lVar33;
          pdVar24 = pdVar24 + lVar35;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      uVar27 = uVar27 + 1;
      pdVar12 = pdVar12 + lVar30 * lVar35;
    } while (uVar27 != iVar19 + 1);
  }
  iVar19 = (int)(lVar36 + -1);
  if (2 < iVar10) {
    iVar9 = 3;
    if (3 < iVar25) {
      iVar9 = iVar25;
    }
    iVar28 = 2;
    if (2 < iVar25) {
      iVar28 = iVar25;
    }
    lVar39 = (((ulong)uVar13 - 2) * lVar30 + 1) * lVar33;
    pdVar12 = cc1 + lVar39 + lVar15;
    lVar31 = lVar30 * lVar33;
    lVar32 = (lVar30 * 2 + 1) * lVar33;
    pdVar24 = cc1 + lVar32 + lVar15;
    local_100 = cc1 + lVar39 + 2;
    local_d8 = cc1 + lVar32 + 2;
    local_a0 = 2;
    do {
      if (0 < iVar5) {
        lVar39 = (lVar36 + -1 + local_a0 + -1) * lVar29;
        lVar16 = ((long)(iVar19 * 2) + local_a0 + -1) * lVar29;
        lVar22 = 0x10;
        lVar32 = uVar37 - 1;
        pdVar17 = ch1 + ((long)(iVar5 * iVar10) + 1) * lVar35 + 2;
        pdVar34 = ch1 + (lVar30 + 1) * lVar35 + 2;
        pdVar11 = ch1 + ((long)(iVar5 * 2) + 1) * lVar35 + 2;
        do {
          *(double *)((long)pdVar24 + lVar22 + -8) =
               wa[(long)(int)uVar8 + lVar39 + 1] * pdVar11[lVar38 + -1] + pdVar34[lVar38 + -1];
          *(double *)((long)pdVar12 + lVar22 + -8) =
               -wa[(long)(int)uVar8 + lVar16 + 1] * pdVar17[lVar38 + -1];
          *(double *)((long)pdVar24 + lVar22) =
               wa[(long)(int)uVar8 + lVar39 + 1] * pdVar11[lVar38] + pdVar34[lVar38];
          *(double *)((long)pdVar12 + lVar22) = -wa[(long)(int)uVar8 + lVar16 + 1] * pdVar17[lVar38]
          ;
          lVar22 = lVar22 + lVar33 * 8;
          pdVar17 = pdVar17 + lVar35;
          pdVar11 = pdVar11 + lVar35;
          pdVar34 = pdVar34 + lVar35;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      if (4 < iVar10) {
        uVar27 = 3;
        pdVar17 = ch1 + (((ulong)uVar13 - 3) * lVar30 + 1) * lVar35 + lVar38;
        pdVar34 = ch1 + (lVar30 * 3 + 1) * lVar35 + lVar38;
        do {
          iVar20 = (((int)uVar27 + -1) * ((int)local_a0 + -1)) % iVar10;
          if (0 < iVar5) {
            dVar40 = wa[(long)(int)uVar8 + (long)(int)((iVar19 + iVar20) * uVar4) + 1];
            dVar1 = wa[(long)(int)uVar8 + (long)(int)((iVar20 + iVar19 * 2) * uVar4) + 1];
            lVar39 = 0x10;
            lVar32 = uVar37 - 1;
            pdVar11 = local_d8;
            pdVar23 = local_100;
            do {
              pdVar11[lVar15 + -1] =
                   *(double *)((long)pdVar34 + lVar39 + -8) * dVar40 + pdVar11[lVar15 + -1];
              pdVar23[lVar15 + -1] =
                   *(double *)((long)pdVar17 + lVar39 + -8) * -dVar1 + pdVar23[lVar15 + -1];
              pdVar11[lVar15] = *(double *)((long)pdVar34 + lVar39) * dVar40 + pdVar11[lVar15];
              pdVar23[lVar15] = *(double *)((long)pdVar17 + lVar39) * -dVar1 + pdVar23[lVar15];
              pdVar23 = pdVar23 + lVar33;
              lVar39 = lVar39 + lVar35 * 8;
              pdVar11 = pdVar11 + lVar33;
              lVar32 = lVar32 + -1;
            } while (lVar32 != 0);
          }
          uVar27 = uVar27 + 1;
          pdVar17 = pdVar17 + -(lVar30 * lVar35);
          pdVar34 = pdVar34 + lVar30 * lVar35;
        } while (uVar27 != iVar9 + 1);
      }
      local_a0 = local_a0 + 1;
      pdVar12 = pdVar12 + -lVar31;
      pdVar24 = pdVar24 + lVar31;
      local_100 = local_100 + -lVar31;
      local_d8 = local_d8 + lVar31;
    } while (local_a0 != iVar28 + 1);
  }
  if ((int)uVar4 < 2) {
    dVar40 = 1.0 / (double)(iVar7 * iVar10);
    if (*na == 1) {
      if (0 < iVar5) {
        pdVar12 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
        pdVar24 = cc1 + (lVar30 + 1) * lVar33 + lVar15 + 2;
        lVar21 = uVar37 - 1;
        do {
          pdVar12[-1] = pdVar24[-1] * dVar40;
          *pdVar12 = *pdVar24 * dVar40;
          pdVar12 = pdVar12 + lVar35;
          pdVar24 = pdVar24 + lVar33;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      if (2 < iVar10) {
        iVar10 = 2;
        if (2 < iVar25) {
          iVar10 = iVar25;
        }
        lVar21 = ((ulong)uVar13 - 2) * lVar30 + 1;
        pdVar12 = ch1 + lVar21 * lVar35 + 2;
        pdVar24 = cc1 + lVar21 * lVar33 + lVar15;
        lVar21 = lVar30 * 2 + 1;
        pdVar17 = ch1 + lVar21 * lVar35 + 2;
        pdVar34 = cc1 + lVar21 * lVar33 + lVar15;
        uVar26 = 2;
        do {
          if (0 < iVar5) {
            lVar21 = 0x10;
            pdVar11 = pdVar12;
            pdVar23 = pdVar17;
            lVar15 = uVar37 - 1;
            do {
              pdVar23[lVar38 + -1] =
                   (*(double *)((long)pdVar34 + lVar21 + -8) - *(double *)((long)pdVar24 + lVar21))
                   * dVar40;
              pdVar23[lVar38] =
                   (*(double *)((long)pdVar34 + lVar21) + *(double *)((long)pdVar24 + lVar21 + -8))
                   * dVar40;
              pdVar11[lVar38 + -1] =
                   (*(double *)((long)pdVar34 + lVar21 + -8) + *(double *)((long)pdVar24 + lVar21))
                   * dVar40;
              pdVar11[lVar38] =
                   (*(double *)((long)pdVar34 + lVar21) - *(double *)((long)pdVar24 + lVar21 + -8))
                   * dVar40;
              pdVar11 = pdVar11 + lVar35;
              lVar21 = lVar21 + lVar33 * 8;
              pdVar23 = pdVar23 + lVar35;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          uVar26 = uVar26 + 1;
          pdVar12 = pdVar12 + -(lVar30 * lVar35);
          pdVar24 = pdVar24 + -(lVar30 * lVar33);
          pdVar17 = pdVar17 + lVar30 * lVar35;
          pdVar34 = pdVar34 + lVar30 * lVar33;
        } while (uVar26 != iVar10 + 1);
      }
    }
    else {
      if (0 < iVar5) {
        pdVar12 = cc1 + (lVar30 + 1) * lVar33 + lVar15 + 1;
        lVar21 = uVar37 - 1;
        do {
          *pdVar12 = *pdVar12 * dVar40;
          pdVar12[1] = pdVar12[1] * dVar40;
          pdVar12 = pdVar12 + lVar33;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
      }
      if (2 < iVar10) {
        iVar10 = 2;
        if (2 < iVar25) {
          iVar10 = iVar25;
        }
        pdVar12 = cc1 + (((ulong)uVar13 - 2) * lVar30 + 1) * lVar33 + lVar15 + 2;
        pdVar24 = cc1 + (lVar30 * 2 + 1) * lVar33 + lVar15 + 2;
        uVar26 = 2;
        do {
          if (0 < iVar5) {
            lVar21 = 0;
            lVar15 = uVar37 - 1;
            do {
              dVar1 = *(double *)((long)pdVar12 + lVar21);
              dVar2 = *(double *)((long)pdVar24 + lVar21 + -8);
              *(double *)((long)pdVar24 + lVar21 + -8) = (dVar2 - dVar1) * dVar40;
              dVar3 = *(double *)((long)pdVar12 + lVar21 + -8);
              *(double *)((long)pdVar12 + lVar21) =
                   (*(double *)((long)pdVar24 + lVar21) - dVar3) * dVar40;
              *(double *)((long)pdVar24 + lVar21) =
                   (dVar3 + *(double *)((long)pdVar24 + lVar21)) * dVar40;
              *(double *)((long)pdVar12 + lVar21 + -8) = (dVar2 + dVar1) * dVar40;
              lVar21 = lVar21 + lVar33 * 8;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          uVar26 = uVar26 + 1;
          pdVar12 = pdVar12 + -(lVar30 * lVar33);
          pdVar24 = pdVar24 + lVar30 * lVar33;
        } while (uVar26 != iVar10 + 1);
      }
    }
  }
  else {
    if (0 < iVar5) {
      pdVar12 = ch1 + (lVar30 + 1) * lVar35 + lVar38 + 2;
      pdVar24 = cc1 + (lVar30 + 1) * lVar33 + lVar15 + 2;
      lVar32 = uVar37 - 1;
      do {
        pdVar12[-1] = pdVar24[-1];
        *pdVar12 = *pdVar24;
        pdVar12 = pdVar12 + lVar35;
        pdVar24 = pdVar24 + lVar33;
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
    }
    lVar32 = (long)(int)(~(iVar7 * uVar18) * iVar14 + -1);
    lVar39 = (long)(int)(~((uVar4 + 1) * iVar7) * iVar6 + -1);
    if (2 < iVar10) {
      iVar14 = 2;
      if (2 < iVar25) {
        iVar14 = iVar25;
      }
      lVar31 = ((ulong)uVar13 - 2) * lVar30 + 1;
      pdVar12 = ch1 + lVar31 * lVar35 + 2;
      pdVar17 = cc1 + lVar31 * lVar33 + lVar15;
      lVar31 = lVar30 * 2 + 1;
      pdVar24 = ch1 + lVar31 * lVar35 + 2;
      pdVar34 = cc1 + lVar31 * lVar33 + lVar15;
      uVar27 = 2;
      do {
        if (0 < iVar5) {
          lVar31 = 0x10;
          lVar15 = uVar37 - 1;
          pdVar11 = pdVar24;
          pdVar23 = pdVar12;
          do {
            pdVar11[lVar38 + -1] =
                 *(double *)((long)pdVar34 + lVar31 + -8) - *(double *)((long)pdVar17 + lVar31);
            pdVar11[lVar38] =
                 *(double *)((long)pdVar34 + lVar31) + *(double *)((long)pdVar17 + lVar31 + -8);
            pdVar23[lVar38 + -1] =
                 *(double *)((long)pdVar34 + lVar31 + -8) + *(double *)((long)pdVar17 + lVar31);
            pdVar23[lVar38] =
                 *(double *)((long)pdVar34 + lVar31) - *(double *)((long)pdVar17 + lVar31 + -8);
            pdVar23 = pdVar23 + lVar35;
            lVar31 = lVar31 + lVar33 * 8;
            pdVar11 = pdVar11 + lVar35;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        uVar27 = uVar27 + 1;
        pdVar12 = pdVar12 + -(lVar30 * lVar35);
        pdVar17 = pdVar17 + -(lVar30 * lVar33);
        pdVar24 = pdVar24 + lVar30 * lVar35;
        pdVar34 = pdVar34 + lVar30 * lVar33;
      } while (uVar27 != iVar14 + 1);
    }
    uVar13 = 1;
    if (1 < (int)uVar4) {
      uVar13 = uVar4;
    }
    pdVar12 = cc + ((lVar36 + 1) * lVar21 + 1) * lVar33 + lVar32 + 2;
    pdVar24 = ch + ((uVar26 + 1) * lVar21 + 1) * lVar35 + lVar39 + 2;
    lVar15 = lVar21 * lVar35;
    uVar37 = 1;
    do {
      lVar30 = (ulong)(iVar7 + 1) - 1;
      pdVar17 = pdVar24;
      pdVar34 = pdVar12;
      if (0 < iVar7) {
        do {
          pdVar34[-1] = pdVar17[-1];
          *pdVar34 = *pdVar17;
          pdVar34 = pdVar34 + lVar33;
          pdVar17 = pdVar17 + lVar35;
          lVar30 = lVar30 + -1;
        } while (lVar30 != 0);
      }
      uVar37 = uVar37 + 1;
      pdVar12 = pdVar12 + lVar36 * lVar21 * lVar33;
      pdVar24 = pdVar24 + lVar15;
    } while (uVar37 != uVar13 + 1);
    if (1 < iVar10) {
      pdVar12 = cc + ((lVar36 + 2) * lVar21 + 1) * lVar33 + lVar32 + 2;
      pdVar24 = ch + ((uVar26 * 2 + 1) * lVar21 + 1) * lVar35 + lVar39 + 2;
      uVar37 = 2;
      do {
        lVar30 = (ulong)(iVar7 + 1) - 1;
        pdVar17 = pdVar12;
        pdVar34 = pdVar24;
        if (0 < iVar7) {
          do {
            pdVar17[-1] = pdVar34[-1];
            *pdVar17 = *pdVar34;
            pdVar17 = pdVar17 + lVar33;
            pdVar34 = pdVar34 + lVar35;
            lVar30 = lVar30 + -1;
          } while (lVar30 != 0);
        }
        uVar37 = uVar37 + 1;
        pdVar12 = pdVar12 + lVar21 * lVar33;
        pdVar24 = pdVar24 + lVar15 * uVar26;
      } while (uVar37 != uVar18);
    }
    if (1 < iVar10) {
      uVar13 = 2;
      if (2 < (int)uVar4) {
        uVar13 = uVar4;
      }
      pdVar24 = cc + ((lVar36 * 2 + 2) * lVar21 + 1) * lVar33 + lVar32 + 2;
      pdVar12 = ch + (((ulong)uVar4 * 2 + 2) * lVar21 + 1) * lVar35 + lVar39 + 2;
      uVar37 = 2;
      do {
        lVar30 = ((long)iVar19 + uVar37 + -1) * lVar29;
        lVar38 = ((long)(iVar19 * 2) + uVar37 + -1) * uVar26;
        uVar27 = 2;
        pdVar17 = pdVar12;
        pdVar34 = pdVar24;
        do {
          pdVar11 = pdVar34;
          pdVar23 = pdVar17;
          lVar32 = (ulong)(iVar7 + 1) - 1;
          if (0 < iVar7) {
            do {
              pdVar11[-1] = wa[(long)(int)uVar8 + lVar30 + uVar27] * pdVar23[-1] +
                            wa[(long)(int)uVar8 + lVar38 + uVar27] * *pdVar23;
              *pdVar11 = wa[(long)(int)uVar8 + lVar30 + uVar27] * *pdVar23 -
                         pdVar23[-1] * wa[(long)(int)uVar8 + lVar38 + uVar27];
              lVar32 = lVar32 + -1;
              pdVar11 = pdVar11 + lVar33;
              pdVar23 = pdVar23 + lVar35;
            } while (lVar32 != 0);
          }
          uVar27 = uVar27 + 1;
          pdVar34 = pdVar34 + lVar33 * lVar21 * lVar36;
          pdVar17 = pdVar17 + lVar15;
        } while (uVar27 != uVar13 + 1);
        uVar37 = uVar37 + 1;
        pdVar24 = pdVar24 + lVar33 * lVar21;
        pdVar12 = pdVar12 + lVar15 * (ulong)uVar4;
      } while (uVar37 != uVar18);
    }
  }
  return 0;
}

Assistant:

int c1fgkf_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t sn, wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = -wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1) {
	goto L136;
    }
    sn = 1.0 / (fft_real_t) (*ip * *l1);
    if (*na == 1) {
	goto L146;
    }
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	cc1[(ki + cc1_dim2) * cc1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	cc1[(ki + cc1_dim2) * cc1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L149: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    chold2 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L146:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L147: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
/* L144: */
	}
/* L145: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
/* L134: */
	}
/* L135: */
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}